

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

vm_obj_id_t CVmObjWeakRefLookupTable::create(int in_root_set,uint bucket_count,uint init_capacity)

{
  vm_obj_id_t obj_id;
  CVmObjLookupTable *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,1,1);
  this = (CVmObjLookupTable *)CVmObject::operator_new(0x10,obj_id);
  CVmObjLookupTable::CVmObjLookupTable(this,(ulong)bucket_count,(ulong)init_capacity);
  (this->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_0036f080;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjWeakRefLookupTable::
   create(VMG_ int in_root_set, uint bucket_count, uint init_capacity)
{
    vm_obj_id_t id;

    /* allocate the object ID */
    id = vm_new_id(vmg_ in_root_set, TRUE, TRUE);

    /* create the object */
    new (vmg_ id) CVmObjWeakRefLookupTable(vmg_ bucket_count, init_capacity);

    /* return the new ID */
    return id;
}